

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

SystemTimingCheckSymbol *
slang::ast::SystemTimingCheckSymbol::fromSyntax(Scope *parent,SystemTimingCheckSyntax *syntax)

{
  Token *this;
  char *pcVar1;
  Compilation *this_00;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint64_t uVar6;
  Diagnostic *this_01;
  SystemTimingCheckSymbol *pSVar7;
  ulong uVar8;
  long lVar9;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  char cVar13;
  char cVar14;
  char cVar15;
  byte bVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  byte bVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  SourceRange sourceRange;
  string_view arg;
  Token local_78;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  SourceLocation local_40;
  SystemTimingCheckDef *local_38;
  
  this = &syntax->name;
  local_78 = (Token)parsing::Token::valueText(this);
  uVar6 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                     &SystemTimingCheckDefs,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_78);
  uVar10 = uVar6 >> (SystemTimingCheckDefs & 0x3f);
  lVar11 = (uVar6 & 0xff) * 4;
  cVar13 = (&UNK_0043a38c)[lVar11];
  cVar14 = (&UNK_0043a38d)[lVar11];
  cVar15 = (&UNK_0043a38e)[lVar11];
  bVar16 = (&UNK_0043a38f)[lVar11];
  uVar8 = 0;
  cVar17 = cVar13;
  cVar18 = cVar14;
  cVar19 = cVar15;
  bVar20 = bVar16;
  cVar21 = cVar13;
  cVar22 = cVar14;
  cVar23 = cVar15;
  bVar24 = bVar16;
  cVar25 = cVar13;
  cVar26 = cVar14;
  cVar27 = cVar15;
  bVar28 = bVar16;
  do {
    pcVar1 = (char *)(DAT_006006e0 + uVar10 * 0x10);
    local_58 = *pcVar1;
    cStack_57 = pcVar1[1];
    cStack_56 = pcVar1[2];
    bStack_55 = pcVar1[3];
    cStack_54 = pcVar1[4];
    cStack_53 = pcVar1[5];
    cStack_52 = pcVar1[6];
    bStack_51 = pcVar1[7];
    cStack_50 = pcVar1[8];
    cStack_4f = pcVar1[9];
    cStack_4e = pcVar1[10];
    bStack_4d = pcVar1[0xb];
    cStack_4c = pcVar1[0xc];
    cStack_4b = pcVar1[0xd];
    cStack_4a = pcVar1[0xe];
    bVar4 = pcVar1[0xf];
    auVar12[0] = -(local_58 == cVar13);
    auVar12[1] = -(cStack_57 == cVar14);
    auVar12[2] = -(cStack_56 == cVar15);
    auVar12[3] = -(bStack_55 == bVar16);
    auVar12[4] = -(cStack_54 == cVar17);
    auVar12[5] = -(cStack_53 == cVar18);
    auVar12[6] = -(cStack_52 == cVar19);
    auVar12[7] = -(bStack_51 == bVar20);
    auVar12[8] = -(cStack_50 == cVar21);
    auVar12[9] = -(cStack_4f == cVar22);
    auVar12[10] = -(cStack_4e == cVar23);
    auVar12[0xb] = -(bStack_4d == bVar24);
    auVar12[0xc] = -(cStack_4c == cVar25);
    auVar12[0xd] = -(cStack_4b == cVar26);
    auVar12[0xe] = -(cStack_4a == cVar27);
    auVar12[0xf] = -(bVar4 == bVar28);
    uVar5 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar4;
    if (uVar5 != 0) {
      lVar9 = DAT_006006e0 + uVar10 * 0x10;
      lVar11 = DAT_006006e8 + uVar10 * 0x348;
      local_68 = cVar13;
      cStack_67 = cVar14;
      cStack_66 = cVar15;
      bStack_65 = bVar16;
      cStack_64 = cVar17;
      cStack_63 = cVar18;
      cStack_62 = cVar19;
      bStack_61 = bVar20;
      cStack_60 = cVar21;
      cStack_5f = cVar22;
      cStack_5e = cVar23;
      bStack_5d = bVar24;
      cStack_5c = cVar25;
      cStack_5b = cVar26;
      cStack_5a = cVar27;
      bStack_59 = bVar28;
      do {
        uVar2 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)((ulong)uVar2 * 0x38 + lVar11);
        bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           &SystemTimingCheckDefs,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_78,__y);
        if (bVar3) {
          local_38 = (SystemTimingCheckDef *)(__y + 1);
          goto LAB_0025cc8e;
        }
        uVar5 = uVar5 - 1 & uVar5;
      } while (uVar5 != 0);
      bVar4 = *(byte *)(lVar9 + 0xf);
      cVar13 = local_68;
      cVar14 = cStack_67;
      cVar15 = cStack_66;
      bVar16 = bStack_65;
      cVar17 = cStack_64;
      cVar18 = cStack_63;
      cVar19 = cStack_62;
      bVar20 = bStack_61;
      cVar21 = cStack_60;
      cVar22 = cStack_5f;
      cVar23 = cStack_5e;
      bVar24 = bStack_5d;
      cVar25 = cStack_5c;
      cVar26 = cStack_5b;
      cVar27 = cStack_5a;
      bVar28 = bStack_59;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar6 & 7] & bVar4) == 0) break;
    lVar11 = uVar10 + uVar8;
    uVar8 = uVar8 + 1;
    uVar10 = lVar11 + 1U & DAT_006006d8;
  } while (uVar8 <= DAT_006006d8);
  sourceRange = parsing::Token::range(this);
  this_01 = Scope::addDiag(parent,(DiagCode)0xd20006,sourceRange);
  arg = parsing::Token::valueText(this);
  Diagnostic::operator<<(this_01,arg);
  local_38 = (SystemTimingCheckDef *)0x0;
LAB_0025cc8e:
  this_00 = parent->compilation;
  local_78 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_40 = parsing::Token::location(&local_78);
  pSVar7 = BumpAllocator::
           emplace<slang::ast::SystemTimingCheckSymbol,slang::SourceLocation,slang::ast::SystemTimingCheckDef_const*&>
                     (&this_00->super_BumpAllocator,&local_40,&local_38);
  (pSVar7->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  return pSVar7;
}

Assistant:

SystemTimingCheckSymbol& SystemTimingCheckSymbol::fromSyntax(
    const Scope& parent, const SystemTimingCheckSyntax& syntax) {

    const SystemTimingCheckDef* def;
    if (auto it = SystemTimingCheckDefs.find(syntax.name.valueText());
        it != SystemTimingCheckDefs.end()) {
        def = &it->second;
    }
    else {
        parent.addDiag(diag::UnknownSystemTimingCheck, syntax.name.range())
            << syntax.name.valueText();
        def = nullptr;
    }

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<SystemTimingCheckSymbol>(syntax.getFirstToken().location(), def);
    result->setSyntax(syntax);
    return *result;
}